

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interp.cc
# Opt level: O2

RunResult __thiscall
wabt::interp::Thread::DoSimdBinop<unsigned_int,float>
          (Thread *this,BinopFunc<unsigned_int,_float> *f)

{
  uint uVar1;
  u8 i;
  long lVar2;
  Simd<float,_(unsigned_char)__x04_> SVar3;
  SR result;
  Simd<float,_(unsigned_char)__x04_> lhs;
  Simd<float,_(unsigned_char)__x04_> rhs;
  Simd<unsigned_int,_(unsigned_char)__x04_> local_48;
  float local_38 [4];
  float local_28 [4];
  
  local_28 = (float  [4])Pop<wabt::interp::Simd<float,(unsigned_char)4>>(this);
  SVar3 = Pop<wabt::interp::Simd<float,(unsigned_char)4>>(this);
  local_38[0] = SVar3.v[0];
  local_38[1] = SVar3.v[1];
  local_38[2] = SVar3.v[2];
  local_38[3] = SVar3.v[3];
  for (lVar2 = 0; lVar2 != 4; lVar2 = lVar2 + 1) {
    uVar1 = (*f)(local_38[lVar2],local_28[lVar2]);
    local_48.v[lVar2] = uVar1;
  }
  Push<wabt::interp::Simd<unsigned_int,(unsigned_char)4>>(this,local_48);
  return Ok;
}

Assistant:

RunResult Thread::DoSimdBinop(BinopFunc<R, T> f) {
  using ST = typename Simd128<T>::Type;
  using SR = typename Simd128<R>::Type;
  static_assert(ST::lanes == SR::lanes, "SIMD lanes don't match");
  auto rhs = Pop<ST>();
  auto lhs = Pop<ST>();
  SR result;
  for (u8 i = 0; i < SR::lanes; ++i) {
    result[i] = f(lhs[i], rhs[i]);
  }
  Push(result);
  return RunResult::Ok;
}